

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_set_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Intrusive_set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>
::Intrusive_set_column
          (Intrusive_set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>
           *this,Column_settings *colSettings)

{
  Column_settings *local_30;
  Column_settings *colSettings_local;
  Intrusive_set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>
  *this_local;
  
  Row_access<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>
  ::Row_access(&this->super_Row_access_option);
  Column_dimension_holder<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>
  ::Column_dimension_holder(&this->super_Column_dimension_option);
  Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>
  ::Chain_column_extra_properties(&this->super_Chain_column_option);
  boost::intrusive::
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::set_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_column_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)1>_>_>_>
  ::set(&this->column_);
  this->operators_ = (Field_operators *)0x0;
  local_30 = colSettings;
  if (colSettings == (Column_settings *)0x0) {
    local_30 = (Column_settings *)0x0;
  }
  this->entryPool_ = (Entry_constructor *)local_30;
  return;
}

Assistant:

inline Intrusive_set_column<Master_matrix>::Intrusive_set_column(Column_settings* colSettings)
    : RA_opt(),
      Dim_opt(),
      Chain_opt(),
      operators_(nullptr),
      entryPool_(colSettings == nullptr ? nullptr : &(colSettings->entryConstructor))
{
  if (operators_ == nullptr && entryPool_ == nullptr)
    return;  // to allow default constructor which gives a dummy column
  if constexpr (!Master_matrix::Option_list::is_z2) {
    operators_ = &(colSettings->operators);
  }
}